

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O3

void __thiscall
kj::_::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
          (Fault *this,char *file,int line,int code,char *condition,char *macroArgs,PathPtr *params,
          PathPtr *params_1)

{
  long lVar1;
  undefined8 uVar2;
  long lVar3;
  String argValues [2];
  char **ppcVar4;
  undefined8 uVar5;
  String local_80;
  char *local_68;
  size_t local_60;
  ArrayDisposer *pAStack_58;
  char *local_50;
  size_t sStack_48;
  ArrayDisposer *pAStack_40;
  
  this->exception = (Exception *)0x0;
  PathPtr::toString(&local_80,params,false);
  local_68 = local_80.content.ptr;
  local_60 = local_80.content.size_;
  pAStack_58 = local_80.content.disposer;
  PathPtr::toString(&local_80,params_1,false);
  ppcVar4 = &local_68;
  local_50 = local_80.content.ptr;
  sStack_48 = local_80.content.size_;
  pAStack_40 = local_80.content.disposer;
  uVar5 = 2;
  init(this,(EVP_PKEY_CTX *)file);
  lVar3 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_68 + lVar3);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_60 + lVar3);
      *(undefined8 *)((long)&local_68 + lVar3) = 0;
      *(undefined8 *)((long)&local_60 + lVar3) = 0;
      (**(code **)**(undefined8 **)((long)&pAStack_58 + lVar3))
                (*(undefined8 **)((long)&pAStack_58 + lVar3),lVar1,1,uVar2,uVar2,0,ppcVar4,uVar5);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}